

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O3

void __thiscall Map::printMap(Map *this)

{
  pointer pcVar1;
  pointer ppCVar2;
  ostream *poVar3;
  pointer ppCVar4;
  pointer ppCVar5;
  string currContinent;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> countriesInCurrContinent;
  string currCountryName;
  long *local_98;
  long local_90;
  long local_88 [2];
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> local_78;
  long *local_60;
  long local_58;
  long local_50 [2];
  pointer local_40;
  pointer local_38;
  
  ppCVar5 = (this->pMapContinents->
            super__Vector_base<Map::Continent_*,_std::allocator<Map::Continent_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_40 = (this->pMapContinents->
             super__Vector_base<Map::Continent_*,_std::allocator<Map::Continent_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppCVar5 != local_40) {
    do {
      local_98 = local_88;
      pcVar1 = ((*ppCVar5)->pCName->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,pcVar1,pcVar1 + (*ppCVar5)->pCName->_M_string_length);
      std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::vector
                (&local_78,(*ppCVar5)->pCountriesInContinent);
      local_38 = ppCVar5;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 " \n\n\n ######################## \n COUNTRIES IN CONTINENT : ",0x39);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_98,local_90);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"\n ######################## \n",0x1c);
      ppCVar2 = local_78.super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>._M_impl
                .super__Vector_impl_data._M_finish;
      ppCVar5 = local_38;
      for (ppCVar4 = local_78.super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>.
                     _M_impl.super__Vector_impl_data._M_start; local_38 = ppCVar5,
          ppCVar4 != ppCVar2; ppCVar4 = ppCVar4 + 1) {
        pcVar1 = ((*ppCVar4)->cyName->_M_dataplus)._M_p;
        local_60 = local_50;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_60,pcVar1,pcVar1 + (*ppCVar4)->cyName->_M_string_length);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_60,local_58);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," is owned by player ",0x14);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(*ppCVar4)->pPlayerOwnerId);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," and has ",9);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(*ppCVar4)->pNumberOfTroops);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," troops \n",9);
        if (local_60 != local_50) {
          operator_delete(local_60,local_50[0] + 1);
        }
        ppCVar5 = local_38;
      }
      if (local_78.super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_78.
                              super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.
                              super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_98 != local_88) {
        operator_delete(local_98,local_88[0] + 1);
      }
      ppCVar5 = ppCVar5 + 1;
    } while (ppCVar5 != local_40);
  }
  return;
}

Assistant:

void Map::printMap() {
    for (auto& pMapContinent : *this->pMapContinents) {
        std::string currContinent = pMapContinent->getContinentName();
        std::vector<Map::Country*> countriesInCurrContinent = *pMapContinent->getCountriesInContinent();
        std::cout << " \n\n\n ######################## \n COUNTRIES IN CONTINENT : " << currContinent
                  << "\n ######################## \n";
        for (auto& j : countriesInCurrContinent) {
            std::string currCountryName = j->getCountryName();
            std::cout << currCountryName << " is owned by player " << j->getPlayerOwnerID() <<" and has " << j->getNumberOfTroops() << " troops \n";
        }
    }
}